

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.cxx
# Opt level: O2

ptr<srv_config> __thiscall nuraft::srv_config::deserialize(srv_config *this,buffer_serializer *bs)

{
  char *pcVar1;
  char *pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<srv_config> pVar3;
  byte is_learner;
  int32 priority;
  int32 dc_id;
  int32 id;
  string aux;
  string endpoint;
  uint8_t local_6d;
  int32_t local_6c;
  undefined1 local_68 [8];
  char *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_68._4_4_ = buffer_serializer::get_i32(bs);
  local_68._0_4_ = buffer_serializer::get_i32(bs);
  pcVar1 = buffer_serializer::get_cstr(bs);
  pcVar2 = buffer_serializer::get_cstr(bs);
  if (pcVar1 == (char *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&local_40,pcVar1,(allocator *)&local_60);
  }
  if (pcVar2 == (char *)0x0) {
    local_60 = local_58._M_local_buf + 8;
    local_58._M_allocated_capacity = 0;
    local_58._M_local_buf[8] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&local_60,pcVar2,(allocator *)&local_6c);
  }
  local_6d = buffer_serializer::get_u8(bs);
  local_6c = buffer_serializer::get_i32(bs);
  std::
  make_shared<nuraft::srv_config,int&,int&,std::__cxx11::string&,std::__cxx11::string&,unsigned_char&,int&>
            (&this->id_,(int *)(local_68 + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,&local_40
             ,(uchar *)&local_60,(int *)&local_6d);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pVar3.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<srv_config>)pVar3.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<srv_config> srv_config::deserialize(buffer_serializer& bs) {
    int32 id = bs.get_i32();
    int32 dc_id = bs.get_i32();
    const char* endpoint_char = bs.get_cstr();
    const char* aux_char = bs.get_cstr();
    std::string endpoint( (endpoint_char) ? endpoint_char : std::string() );
    std::string aux( (aux_char) ? aux_char : std::string() );
    byte is_learner = bs.get_u8();
    int32 priority = bs.get_i32();
    return cs_new<srv_config>(id, dc_id, endpoint, aux, is_learner, priority);
}